

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_free_svc_cyclic_refresh(AV1_COMP *cpi)

{
  LAYER_CONTEXT *pLVar1;
  int iVar2;
  int sl;
  int iVar3;
  int tl;
  int iVar4;
  
  for (iVar3 = 0; iVar3 < (cpi->svc).number_spatial_layers; iVar3 = iVar3 + 1) {
    for (iVar4 = 0; iVar2 = (cpi->svc).number_temporal_layers, iVar4 < iVar2; iVar4 = iVar4 + 1) {
      iVar2 = iVar2 * iVar3 + iVar4;
      pLVar1 = (cpi->svc).layer_context;
      aom_free(pLVar1[iVar2].map);
      pLVar1[iVar2].map = (int8_t *)0x0;
    }
  }
  return;
}

Assistant:

void av1_free_svc_cyclic_refresh(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      aom_free(lc->map);
      lc->map = NULL;
    }
  }
}